

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_set_stream_user_data
              (nghttp2_session *session,int32_t stream_id,void *stream_user_data)

{
  int iVar1;
  void *pvVar2;
  void **ppvVar3;
  nghttp2_outbound_item *pnVar4;
  int iVar5;
  
  pvVar2 = nghttp2_map_find(&session->streams,stream_id);
  if ((pvVar2 == (void *)0x0) || ((*(byte *)((long)pvVar2 + 0xd8) & 2) != 0)) {
    pvVar2 = (void *)0x0;
  }
  else if (*(int *)((long)pvVar2 + 0xcc) == 5) {
    pvVar2 = (void *)0x0;
  }
  if (pvVar2 == (void *)0x0) {
    iVar5 = -0x1f5;
    if ((((stream_id & 1U) != 0) && (session->server == '\0')) &&
       (pnVar4 = (session->ob_syn).head, pnVar4 != (nghttp2_outbound_item *)0x0)) {
      if ((pnVar4->frame).hd.type != '\x01') {
        __assert_fail("frame->hd.type == NGHTTP2_HEADERS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x1eb8,
                      "int nghttp2_session_set_stream_user_data(nghttp2_session *, int32_t, void *)"
                     );
      }
      if (((pnVar4->frame).hd.stream_id <= stream_id) && ((uint)stream_id < session->next_stream_id)
         ) {
        do {
          iVar1 = (pnVar4->frame).hd.stream_id;
          if (stream_id <= iVar1) {
            if (stream_id < iVar1) {
              return -0x1f5;
            }
            ppvVar3 = &(pnVar4->aux_data).headers.stream_user_data;
            goto LAB_00660836;
          }
          pnVar4 = pnVar4->qnext;
        } while (pnVar4 != (nghttp2_outbound_item *)0x0);
      }
    }
  }
  else {
    ppvVar3 = (void **)((long)pvVar2 + 0x90);
LAB_00660836:
    *ppvVar3 = stream_user_data;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int nghttp2_session_set_stream_user_data(nghttp2_session *session,
                                         int32_t stream_id,
                                         void *stream_user_data) {
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    stream->stream_user_data = stream_user_data;
    return 0;
  }

  if (session->server || !nghttp2_session_is_my_stream_id(session, stream_id) ||
      !nghttp2_outbound_queue_top(&session->ob_syn)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  frame = &nghttp2_outbound_queue_top(&session->ob_syn)->frame;
  assert(frame->hd.type == NGHTTP2_HEADERS);

  if (frame->hd.stream_id > stream_id ||
      (uint32_t)stream_id >= session->next_stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (item = session->ob_syn.head; item; item = item->qnext) {
    if (item->frame.hd.stream_id < stream_id) {
      continue;
    }

    if (item->frame.hd.stream_id > stream_id) {
      break;
    }

    item->aux_data.headers.stream_user_data = stream_user_data;
    return 0;
  }

  return NGHTTP2_ERR_INVALID_ARGUMENT;
}